

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void CloseWSRStream(CManager cm,void *WSR_Stream_v)

{
  SstStream s;
  byte *pbVar1;
  int iVar2;
  
  s = *WSR_Stream_v;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  CP_verbose(s,PerRankVerbose,"Delayed task Moving Reader stream %p to status %s\n",WSR_Stream_v,
             SSTStreamStatusStr[3]);
  CP_PeerFailCloseWSReader((WS_ReaderInfo)WSR_Stream_v,PeerClosed);
  pbVar1 = (byte *)s->ConfigParams->DataTransport;
  iVar2 = *pbVar1 - 0x6d;
  if ((iVar2 == 0) && (iVar2 = pbVar1[1] - 0x70, iVar2 == 0)) {
    iVar2 = 0x69 - (uint)pbVar1[2];
  }
  else {
    iVar2 = -iVar2;
  }
  if ((iVar2 == 0) && (*(long *)((long)WSR_Stream_v + 0x70) != 0)) {
    (**(code **)(*(long *)(*WSR_Stream_v + 0xb0) + 0xa8))(&Svcs);
    *(undefined8 *)((long)WSR_Stream_v + 0x70) = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  return;
}

Assistant:

static void CloseWSRStream(CManager cm, void *WSR_Stream_v)
{
    WS_ReaderInfo CP_WSR_Stream = (WS_ReaderInfo)WSR_Stream_v;
    SstStream ParentStream = CP_WSR_Stream->ParentStream;

    STREAM_MUTEX_LOCK(ParentStream);
    CP_verbose(ParentStream, PerRankVerbose, "Delayed task Moving Reader stream %p to status %s\n",
               (void *)CP_WSR_Stream, SSTStreamStatusStr[PeerClosed]);
    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerClosed);

    if (strncmp("mpi", ParentStream->ConfigParams->DataTransport, 3) == 0 &&
        CP_WSR_Stream->DP_WSR_Stream)
    {
        CP_WSR_Stream->ParentStream->DP_Interface->destroyWriterPerReader(
            &Svcs, CP_WSR_Stream->DP_WSR_Stream);
        CP_WSR_Stream->DP_WSR_Stream = NULL;
    }
    STREAM_MUTEX_UNLOCK(ParentStream);
}